

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

int one_hit_new(CHAR_DATA *ch,CHAR_DATA *victim,int dt,bool specials,bool blockable,int addition,
               int multiplier,char *dnoun)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CClass *pCVar6;
  AFFECT_DATA *pAVar7;
  OBJ_AFFECT_DATA *pOVar8;
  short sVar9;
  uint uVar10;
  long lVar11;
  short *psVar12;
  OBJ_DATA *pOVar13;
  float local_b4;
  int dt_local;
  int local_ac;
  OBJ_DATA *local_a8;
  ulong local_a0;
  AFFECT_DATA af;
  
  if (victim == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (victim == ch) {
    return 0;
  }
  if (victim->position == 0) {
    return 0;
  }
  if ((ch->in_room != victim->in_room) && (gsn_hurl != dt)) {
    return 0;
  }
  dt_local = dt;
  bVar1 = is_safe_new(ch,victim,true);
  iVar5 = dt_local;
  if (bVar1) {
    return 0;
  }
  if (dt_local == -3) {
    dt_local = -1;
  }
  local_a8 = get_eq_char(ch,0x10);
  if (dt_local == gsn_dual_wield) {
    local_a8 = get_eq_char(ch,0x12);
  }
  if ((dt_local == -1) || (dt_local == gsn_dual_wield)) {
    if ((local_a8 == (OBJ_DATA *)0x0) || (local_a8->item_type != 5)) {
      iVar3 = (int)ch->dam_type;
    }
    else {
      iVar3 = local_a8->value[3];
    }
    dt_local = iVar3 + 1000;
  }
  if (local_a8 == (OBJ_DATA *)0x0) {
    lVar11 = (long)ch->dam_type;
  }
  else {
    lVar11 = (long)local_a8->value[3];
  }
  local_ac = 1;
  if (attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
      super__Vector_impl_data._M_start[lVar11].damage != -1) {
    local_ac = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11].damage;
  }
  iVar3 = get_weapon_sn_new(ch,dt_local);
  iVar4 = get_weapon_skill(ch,iVar3);
  if (iVar5 == -3) {
    local_ac = 0x13;
  }
  local_a0 = (ulong)(iVar4 + 0x14);
  bVar1 = is_npc(ch);
  if (local_a8 == (OBJ_DATA *)0x0 && bVar1) {
    iVar5 = dice((int)ch->damage[0],(int)ch->damage[1]);
  }
  else {
    if (iVar3 != -1) {
      check_improve(ch,iVar3,true,5);
    }
    pOVar13 = local_a8;
    if (local_a8 != (OBJ_DATA *)0x0) {
      iVar5 = dice(local_a8->value[1],local_a8->value[2]);
      local_b4 = (float)((iVar5 * (int)local_a0) / 100);
      iVar5 = (int)pOVar13->level - (int)ch->level;
      if (iVar5 < 0x23) {
        if (0x18 < iVar5) {
          local_b4 = local_b4 * 7.0;
          goto LAB_00292979;
        }
        if (0xe < iVar5) {
          local_b4 = local_b4 * 8.0;
          goto LAB_00292979;
        }
        if (4 < iVar5) {
          local_b4 = local_b4 * 9.0;
          goto LAB_00292979;
        }
      }
      else {
        local_b4 = local_b4 * 6.0;
LAB_00292979:
        local_b4 = local_b4 / 10.0;
      }
      bVar1 = is_weapon_stat(pOVar13,3);
      if (bVar1) {
        iVar4 = number_percent();
        iVar5 = (int)local_a0;
        iVar3 = iVar5 + 7;
        if (-1 < iVar5) {
          iVar3 = iVar5;
        }
        if (iVar4 <= iVar3 >> 3) {
          local_b4 = local_b4 * 1.2;
        }
      }
      goto LAB_002922aa;
    }
    iVar5 = number_range((int)local_a0 / 0x19 + 1,(((ch->level * 2) / 3) * (int)local_a0) / 100);
  }
  local_b4 = (float)iVar5;
LAB_002922aa:
  iVar5 = get_skill(ch,(int)gsn_enhanced_damage);
  if (iVar5 < 1) {
    local_b4 = local_b4 * 0.7;
  }
  else {
    iVar5 = number_percent();
    iVar3 = get_skill(ch,(int)gsn_enhanced_damage);
    if (iVar5 <= iVar3) {
      check_improve(ch,(int)gsn_enhanced_damage,true,6);
      iVar5 = number_percent();
      local_b4 = (float)(iVar5 / 200 + 3) * local_b4 * 0.5;
    }
    pCVar6 = ch->my_class;
    if ((pCVar6 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar6 = ch->pIndexData->my_class, pCVar6 == (CClass *)0x0)))) {
      pCVar6 = CClass::GetClass(0);
    }
    bVar1 = RString::operator==(&pCVar6->name,"thief");
    if (bVar1) {
      local_b4 = local_b4 * 0.75;
    }
    iVar5 = get_skill(ch,(int)gsn_brutality);
    if ((0 < iVar5) && (bVar1 = is_npc(ch), !bVar1)) {
      iVar5 = number_percent();
      iVar3 = get_skill(ch,(int)gsn_brutality);
      if ((iVar5 < iVar3) &&
         (((bVar1 = style_check((int)gsn_brutality,(int)ch->pcdata->style),
           local_a8 != (OBJ_DATA *)0x0 && (bVar1)) && (0xe < local_a8->weight)))) {
        check_improve(ch,(int)gsn_brutality,true,5);
        local_b4 = local_b4 * 5.0 * 0.25;
      }
    }
  }
  pAVar7 = affect_find(ch->affected,(int)gsn_hardenfist);
  if (((local_a8 == (OBJ_DATA *)0x0) &&
      (bVar1 = is_affected(ch,(int)gsn_hardenfist), pAVar7 != (AFFECT_DATA *)0x0)) && (bVar1)) {
    sVar2 = pAVar7->level;
    sVar9 = sVar2 + 3;
    if (-1 < sVar2) {
      sVar9 = sVar2;
    }
    iVar5 = dice((int)sVar9 >> 2,4);
    local_b4 = (float)(((iVar5 + 10) * (int)local_a0) / 100);
  }
  sVar2 = get_damroll(ch);
  iVar5 = 100;
  if ((int)local_a0 < 100) {
    iVar5 = (int)local_a0;
  }
  local_b4 = (float)((iVar5 * sVar2) / 100) + local_b4;
  bVar1 = is_npc(ch);
  if (!bVar1) {
    local_b4 = pc_race_table[ch->race].racialDam * local_b4;
  }
  bVar1 = is_npc(ch);
  pOVar13 = local_a8;
  if (((!bVar1) && (bVar1 = is_affected(ch,(int)gsn_rage), bVar1)) &&
     ((ch->pcdata->tribe == 1 && (iVar5 = number_percent(), iVar5 < 10)))) {
    send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r",ch);
    act("$n gets an enraged look in $s eyes and delivers a mighty blow!",ch,(void *)0x0,(void *)0x0,
        0);
    local_b4 = (float)((int)ch->level / 0x14) * local_b4;
  }
  if (local_b4 <= 0.0) {
    local_b4 = 1.0;
  }
  bVar1 = is_npc(ch);
  if (((pOVar13 == (OBJ_DATA *)0x0) && (!bVar1)) &&
     ((999 < dt_local || (dt_local == gsn_dual_wield)))) {
    dt_local = 0x3f9;
  }
  if (pOVar13 != (OBJ_DATA *)0x0) {
    pCVar6 = ch->my_class;
    if ((pCVar6 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar6 = ch->pIndexData->my_class, pCVar6 == (CClass *)0x0)))) {
      pCVar6 = CClass::GetClass(0);
    }
    iVar5 = CClass::GetIndex(pCVar6);
    if ((((iVar5 == 4) && (ch->fighting != (CHAR_DATA *)0x0)) && (999 < dt_local)) &&
       (iVar5 = check_arms(ch,pOVar13,false), 0 < iVar5)) {
      dt_local = iVar5 + 1000;
    }
    if ((((pOVar13->pIndexData->spec_prog).trapvector & 0x2000) != 0) &&
       (iVar5 = (*(pOVar13->pIndexData->spec_prog).func)
                          (0x2000,ch,victim,pOVar13,&local_b4,&dt_local,&local_ac), 0 < iVar5)) {
      return 0;
    }
  }
  bVar1 = is_npc(victim);
  if (((bVar1) && ((victim->act[0] & 1) != 0)) &&
     ((((victim->pIndexData->spec_prog).trapvector & 0x2000) != 0 &&
      (iVar5 = (*(victim->pIndexData->spec_prog).func)
                         (0x2000,ch,victim,pOVar13,&local_b4,&dt_local,&local_ac), 0 < iVar5)))) {
    return 0;
  }
  iVar5 = damage_new(ch,victim,(int)local_b4,dt_local,local_ac,true,blockable,addition,multiplier,
                     dnoun);
  if (iVar5 == -1) {
    iVar5 = -1;
  }
  else {
    if ((pOVar13 != (OBJ_DATA *)0x0) && ((pOVar13->progtypes[0] & 0x40000) != 0)) {
      (*pOVar13->pIndexData->iprogs->hit_prog)(pOVar13,ch,victim,iVar5);
    }
    if ((((pOVar13 != (OBJ_DATA *)0x0) && (iVar5 != 0)) && (ch->fighting == victim)) &&
       (bVar1 = is_weapon_stat(pOVar13,7), bVar1)) {
      pOVar8 = affect_find_obj(pOVar13->affected,(int)gsn_poison);
      psVar12 = &pOVar8->level;
      if (pOVar8 == (OBJ_AFFECT_DATA *)0x0) {
        psVar12 = &pOVar13->level;
      }
      sVar2 = *psVar12;
      iVar3 = (int)sVar2;
      bVar1 = saves_spell(iVar3 / 2,victim,8);
      if ((!bVar1) && (bVar1 = is_affected_by(victim,0xc), !bVar1)) {
        send_to_char("You feel poison coursing through your veins.\n\r",victim);
        act("$n is poisoned by the venom on $p.",victim,pOVar13,(void *)0x0,0);
        init_affect(&af);
        pOVar13 = local_a8;
        af.where = 0;
        af.aftype = 0;
        af.type = gsn_poison;
        uVar10 = iVar3 * 3 + 3;
        if (-1 < iVar3 * 3) {
          uVar10 = iVar3 * 3;
        }
        af.level = (short)(uVar10 >> 2);
        af.duration = (short)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (sVar2 >> 0xf);
        af.location = 1;
        af.modifier = -3;
        af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 0x10;
        affect_join(victim,&af);
      }
      if (pOVar8 != (OBJ_AFFECT_DATA *)0x0) {
        sVar2 = 2;
        if (2 < pOVar8->level) {
          sVar2 = pOVar8->level;
        }
        sVar9 = 1;
        if (1 < pOVar8->duration) {
          sVar9 = pOVar8->duration;
        }
        pOVar8->level = sVar2 + -2;
        pOVar8->duration = sVar9 + -1;
        if ((short)(sVar9 + -1) == 0 || (short)(sVar2 + -2) == 0) {
          act("The poison on $p has worn off.",ch,pOVar13,(void *)0x0,3);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int one_hit_new(CHAR_DATA *ch, CHAR_DATA *victim, int dt, bool specials, bool blockable, int addition, int multiplier, char *dnoun)
{
	OBJ_DATA *wield = nullptr, *dualw = nullptr;
	AFFECT_DATA *af;
	int mdam, diceroll, diceroll2 = 0, sn, skill, dam_type, tmp_dt, result, rdt;
	float dam;
	bool truestrike = false;

	if (victim == ch
		|| ch == nullptr
		|| victim == nullptr
		|| victim->position == POS_DEAD
		|| (ch->in_room != victim->in_room && dt != gsn_hurl) || is_safe(ch, victim))
	{
		return 0;
	}

	if (dt == TYPE_TRUESTRIKE)
	{
		truestrike = true;
		dt = TYPE_UNDEFINED;
	}

	wield = get_eq_char(ch, WEAR_WIELD);

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (dt == TYPE_UNDEFINED || dt == gsn_dual_wield)
	{
		dt = TYPE_HIT;

		if (wield != nullptr && wield->item_type == ITEM_WEAPON)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (wield != nullptr)
		dam_type = attack_table[wield->value[3]].damage;
	else
		dam_type = attack_table[ch->dam_type].damage;

	if (dam_type == -1)
		dam_type = DAM_BASH;

	sn = get_weapon_sn_new(ch, dt);
	skill = 20 + get_weapon_skill(ch, sn);

	if (truestrike)
		dam_type = DAM_TRUESTRIKE;

	if (is_npc(ch) && wield == nullptr)
	{
		dam = dice(ch->damage[DICE_NUMBER], ch->damage[DICE_TYPE]);
	}
	else
	{
		if (sn != -1)
			check_improve(ch, sn, true, 5);

		if (wield != nullptr)
		{
			dam = dice(wield->value[1], wield->value[2]) * skill / 100;

			if (wield->level - ch->level >= 35)
				dam = (dam * 6) / 10;
			else if (wield->level - ch->level >= 25)
				dam = (dam * 7) / 10;
			else if (wield->level - ch->level >= 15)
				dam = (dam * 8) / 10;
			else if (wield->level - ch->level >= 5)
				dam = (dam * 9) / 10;

			if (is_weapon_stat(wield, WEAPON_SHARP))
			{
				if (number_percent() <= (skill / 8))
					dam *= 1.2;
			}
		}
		else
		{
			dam = number_range(1 + 4 * skill / 100, 2 * ch->level / 3 * skill / 100);
		}
	}

	if (get_skill(ch, gsn_enhanced_damage) > 0)
	{
		if (number_percent() <= get_skill(ch, gsn_enhanced_damage))
		{
			check_improve(ch, gsn_enhanced_damage, true, 6);
			dam *= 3 + (number_percent() / 200);
			dam /= 2;
		}

		if (ch->Class()->name == "thief")
			dam *= 0.75;

		if (get_skill(ch, gsn_brutality) > 0
			&& !is_npc(ch)
			&& number_percent() < get_skill(ch, gsn_brutality)
			&& style_check(gsn_brutality, ch->pcdata->style)
			&& (wield != nullptr && wield->weight >= 15))
		{
			check_improve(ch, gsn_brutality, true, 5);
			dam *= 5;
			dam /= 4;
		}
	}
	else
	{
		dam *= (float).7;
	}

	af = affect_find(ch->affected, gsn_hardenfist);

	if (wield == nullptr && is_affected(ch, gsn_hardenfist) && af)
		dam = (dice((af->level / 4), 4) + 10) * skill / 100;

	mdam = get_damroll(ch);
	dam += mdam * std::min(100, skill) / 100;

	if (!is_npc(ch))
		dam *= pc_race_table[ch->race].racialDam;

	if (!is_npc(ch) && is_affected(ch, gsn_rage) && ch->pcdata->tribe == TRIBE_BOAR && number_percent() < 10)
	{
		send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r", ch);
		act("$n gets an enraged look in $s eyes and delivers a mighty blow!", ch, 0, 0, TO_ROOM);
		dam *= ch->level / 20;
	}

	if (dam <= 0)
		dam = 1;

	if (!is_npc(ch) && wield == nullptr && (dt >= TYPE_HIT || dt == gsn_dual_wield))
		dt = TYPE_HIT + 17; // hth = #17

	if (wield
		&& ch->Class()->GetIndex() == CLASS_PALADIN
		&& ch->fighting
		&& dt >= TYPE_HIT
		&& (rdt = check_arms(ch, wield, false)) > 0) // check_arms returns 0 if normal
	{
		dt = rdt + TYPE_HIT;
	}

	if (wield && TRAPS_IEVENT(wield, TRAP_IONEHIT))
	{
		if (CALL_IEVENT(wield, TRAP_IONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	// mob onehit [mhit] fires when mob is hit, but item onehit fires when item does the hitting

	if (is_npc(victim) && TRAPS_MEVENT(victim, TRAP_MONEHIT))
	{
		if (CALL_IEVENT(victim, TRAP_MONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	result = damage_new(ch, victim, (int)dam, dt, dam_type, true, blockable, addition, multiplier, dnoun);

	if (result == -1) // death
		return -1;

	if (wield && IS_SET(wield->progtypes, IPROG_HIT))
		(wield->pIndexData->iprogs->hit_prog)(wield, ch, victim, result);

	if (result && wield != nullptr)
	{
		if (ch->fighting == victim && is_weapon_stat(wield, WEAPON_POISON))
		{
			int level = 10;
			OBJ_AFFECT_DATA *poison;
			AFFECT_DATA af;

			poison = affect_find_obj(wield->affected, gsn_poison);

			if (poison == nullptr)
				level = wield->level;
			else
				level = poison->level;

			if (!saves_spell(level / 2, victim, DAM_POISON) && !is_affected_by(victim, AFF_POISON))
			{
				send_to_char("You feel poison coursing through your veins.\n\r", victim);
				act("$n is poisoned by the venom on $p.", victim, wield, nullptr, TO_ROOM);
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.aftype = AFT_SPELL;
				af.type = gsn_poison;
				af.level = level * 3 / 4;
				af.duration = level / 10;
				af.location = APPLY_STR;
				af.modifier = -3;
				SET_BIT(af.bitvector, AFF_POISON);
				affect_join(victim, &af);
			}

			if (poison != nullptr)
			{
				poison->level = std::max(0, poison->level - 2);
				poison->duration = std::max(0, poison->duration - 1);

				if (poison->level == 0 || poison->duration == 0)
					act("The poison on $p has worn off.", ch, wield, nullptr, TO_CHAR);
			}
		}
	}

	return result;
}